

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O1

time_t license::seconds_from_epoch(char *timeString)

{
  int iVar1;
  size_t sVar2;
  invalid_argument *this;
  time_t tVar3;
  int day;
  int month;
  int year;
  tm tm;
  int local_54;
  int local_50;
  int local_4c;
  tm local_48;
  
  sVar2 = strlen(timeString);
  if (sVar2 != 10) {
    if (sVar2 == 8) {
      iVar1 = __isoc99_sscanf(timeString,"%4d%2d%2d",&local_4c,&local_50,&local_54);
      if (iVar1 == 3) goto LAB_001fda04;
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Date not recognized");
    }
    else {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Date not recognized");
    }
LAB_001fda89:
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  iVar1 = __isoc99_sscanf(timeString,"%4d-%2d-%2d",&local_4c,&local_50,&local_54);
  if (iVar1 != 3) {
    iVar1 = __isoc99_sscanf(timeString,"%4d/%2d/%2d",&local_4c,&local_50,&local_54);
    if (iVar1 != 3) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Date not recognized");
      goto LAB_001fda89;
    }
  }
LAB_001fda04:
  local_48.tm_isdst = -1;
  local_48.tm_year = local_4c + -0x76c;
  local_48.tm_mon = local_50 + -1;
  local_48.tm_mday = local_54;
  local_48.tm_hour = 0;
  local_48.tm_sec = 0;
  local_48.tm_min = 0;
  local_48.tm_wday = -1;
  local_48.tm_yday = -1;
  tVar3 = mktime(&local_48);
  return tVar3;
}

Assistant:

time_t seconds_from_epoch(const char* timeString) {
	int year, month, day;
	tm tm;
	if (strlen(timeString) == 8) {
		int nfield = sscanf(timeString, "%4d%2d%2d", &year, &month, &day);
		if (nfield != 3) {
			throw invalid_argument("Date not recognized");
		}
	} else if (strlen(timeString) == 10) {
		int nfield = sscanf(timeString, "%4d-%2d-%2d", &year, &month, &day);
		if (nfield != 3) {
			int nfield = sscanf(timeString, "%4d/%2d/%2d", &year, &month, &day);
			if (nfield != 3) {
				throw invalid_argument("Date not recognized");
			}
		}
	} else{
		throw invalid_argument("Date not recognized");
	}
	tm.tm_isdst = -1;
	tm.tm_year = year - 1900;
	tm.tm_mon = month - 1;
	tm.tm_mday = day;
	tm.tm_hour = 0;
	tm.tm_min = 0;
	tm.tm_sec = 0;
	tm.tm_yday = -1;
	tm.tm_wday = -1;
	return mktime(&tm);
}